

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall ValueTest::checkMemberCount(ValueTest *this,Value *value,uint expectedCount)

{
  bool bVar1;
  ArrayIndex actual;
  TestResult *pTVar2;
  uint actual_00;
  iterator it;
  iterator itEnd;
  PredicateContext local_70;
  
  pTVar2 = (this->super_TestCase).result_;
  actual = Json::Value::size(value);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar2,expectedCount,actual,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x4f8,"expectedCount == value.size()");
  Json::Value::end((Value *)&stack0xffffffffffffffc0);
  Json::Value::begin((Value *)&local_70);
  actual_00 = 0;
  while( true ) {
    bVar1 = Json::ValueIteratorBase::operator!=
                      ((ValueIteratorBase *)&local_70,(SelfType *)&stack0xffffffffffffffc0);
    if (!bVar1) break;
    actual_00 = actual_00 + 1;
    Json::ValueIteratorBase::increment((ValueIteratorBase *)&local_70);
  }
  pTVar2 = JsonTest::checkEqual<unsigned_int,unsigned_int>
                     ((this->super_TestCase).result_,expectedCount,actual_00,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
                      ,0x4ff,"expectedCount == count");
  JsonTest::TestResult::operator<<(pTVar2,(char (*) [22])"Json::Value::iterator");
  pTVar2 = (this->super_TestCase).result_;
  local_70.id_ = pTVar2->predicateId_;
  local_70.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_70.line_ = 0x501;
  local_70.expr_ = "checkConstMemberCount(value, expectedCount)";
  local_70.next_ = (PredicateContext *)0x0;
  local_70.failure_ = (Failure *)0x0;
  pTVar2->predicateStackTail_->next_ = &local_70;
  pTVar2->predicateId_ = local_70.id_ + 1;
  pTVar2->predicateStackTail_ = &local_70;
  checkConstMemberCount(this,value,expectedCount);
  JsonTest::TestResult::popPredicateContext((this->super_TestCase).result_);
  return;
}

Assistant:

void ValueTest::checkMemberCount(Json::Value& value,
                                 unsigned int expectedCount) {
  JSONTEST_ASSERT_EQUAL(expectedCount, value.size());

  unsigned int count = 0;
  Json::Value::iterator itEnd = value.end();
  for (Json::Value::iterator it = value.begin(); it != itEnd; ++it) {
    ++count;
  }
  JSONTEST_ASSERT_EQUAL(expectedCount, count) << "Json::Value::iterator";

  JSONTEST_ASSERT_PRED(checkConstMemberCount(value, expectedCount));
}